

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorRK64.cpp
# Opt level: O0

int __thiscall
pele::physics::reactions::ReactorRK64::react
          (ReactorRK64 *this,Real *rY_in,Real *rYsrc_in,Real *rX_in,Real *rX_src_in,Real *dt_react,
          Real *time,int ncells)

{
  int iVar1;
  anon_class_8_1_df919132 *f;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  double *in_R9;
  double *in_stack_00000008;
  int in_stack_00000010;
  int avgsteps;
  int *d_nsteps;
  DeviceVector<int> v_nsteps;
  RK64Params rkp;
  Real captured_abstol;
  int captured_nsubsteps_max;
  int captured_nsubsteps_min;
  int captured_nsubsteps_guess;
  int captured_reactor_type;
  Real *d_rX_src;
  Real *d_rX;
  Real *d_rYsrc;
  Real *d_rY;
  DeviceVector<amrex::Real> rX_src;
  DeviceVector<amrex::Real> rX;
  DeviceVector<amrex::Real> rYsrc;
  DeviceVector<amrex::Real> rY;
  Real tinyval;
  Real time_out;
  Real time_init;
  anon_class_280_15_fd04d24b *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  PODVector<double,_std::allocator<double>_> *this_00;
  undefined1 local_2d0 [176];
  undefined4 local_220;
  undefined8 local_218;
  undefined8 local_210;
  int *local_208;
  int *local_200;
  undefined4 local_1f4;
  PODVector<int,_std::allocator<int>_> local_1f0;
  undefined1 local_1d8 [176];
  undefined8 local_128;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  undefined8 local_e0;
  PODVector<double,_std::allocator<double>_> local_d8;
  undefined8 local_b8;
  PODVector<double,_std::allocator<double>_> local_b0;
  undefined8 local_90;
  PODVector<double,_std::allocator<double>_> local_88;
  undefined1 local_69 [33];
  undefined8 local_48;
  double local_40;
  double local_38;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_38 = *in_stack_00000008;
  local_40 = *in_stack_00000008 + *in_R9;
  local_48 = 0x358dee7a4ad4b81f;
  f = (anon_class_8_1_df919132 *)(long)(in_stack_00000010 * 0x16);
  local_69._1_8_ = 0;
  this_00 = (PODVector<double,_std::allocator<double>_> *)local_69;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<double>::allocator((allocator<double> *)0x448ecf);
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (this_00,(size_type)f,
             (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (allocator_type *)in_stack_fffffffffffffc18);
  std::allocator<double>::~allocator((allocator<double> *)0x448efd);
  local_90 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x448f33);
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (this_00,(size_type)f,
             (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (allocator_type *)in_stack_fffffffffffffc18);
  std::allocator<double>::~allocator((allocator<double> *)0x448f61);
  local_b8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x448f8c);
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (this_00,(size_type)f,
             (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (allocator_type *)in_stack_fffffffffffffc18);
  std::allocator<double>::~allocator((allocator<double> *)0x448fba);
  local_e0 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x448fe5);
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (this_00,(size_type)f,
             (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (allocator_type *)in_stack_fffffffffffffc18);
  std::allocator<double>::~allocator((allocator<double> *)0x449013);
  local_f0 = amrex::PODVector<double,_std::allocator<double>_>::data
                       ((PODVector<double,_std::allocator<double>_> *)(local_69 + 9));
  local_f8 = amrex::PODVector<double,_std::allocator<double>_>::data(&local_88);
  local_100 = amrex::PODVector<double,_std::allocator<double>_>::data(&local_b0);
  local_108 = amrex::PODVector<double,_std::allocator<double>_>::data(&local_d8);
  amrex::Gpu::copy<double*,double*>
            (local_10,local_10 + (long)(in_stack_00000010 * 0x16) * 8,local_f0);
  amrex::Gpu::copy<double*,double*>
            (local_18,local_18 + (long)(in_stack_00000010 * 0x15) * 8,local_f8);
  amrex::Gpu::copy<double*,double*>(local_20,local_20 + (long)in_stack_00000010 * 8,local_100);
  amrex::Gpu::copy<double*,double*>(local_28,local_28 + (long)in_stack_00000010 * 8,local_108);
  local_110 = *(undefined4 *)(in_RDI + 0xd8);
  local_114 = *(undefined4 *)(in_RDI + 200);
  local_118 = *(undefined4 *)(in_RDI + 0xcc);
  local_11c = *(undefined4 *)(in_RDI + 0xd0);
  local_128 = *(undefined8 *)(in_RDI + 0xc0);
  RK64Params::RK64Params
            ((RK64Params *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  local_1f4 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x449183);
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            ((PODVector<int,_std::allocator<int>_> *)this_00,(size_type)f,
             (value_type *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
             (allocator_type *)in_stack_fffffffffffffc18);
  iVar1 = (int)((ulong)this_00 >> 0x20);
  std::allocator<int>::~allocator((allocator<int> *)0x4491ba);
  local_200 = amrex::PODVector<int,_std::allocator<int>_>::data(&local_1f0);
  memcpy(local_2d0,local_1d8,0xb0);
  local_220 = local_110;
  local_218 = 0x358dee7a4ad4b81f;
  local_210 = local_128;
  local_208 = local_200;
  amrex::
  ParallelFor<int,pele::physics::reactions::ReactorRK64::react(double*,double*,double*,double*,double&,double&,int)::__0,void>
            (in_stack_fffffffffffffc24,in_stack_fffffffffffffc18);
  iVar1 = amrex::Reduce::
          Sum<int,int,pele::physics::reactions::ReactorRK64::react(double*,double*,double*,double*,double&,double&,int)::__1,void>
                    (iVar1,f,in_stack_fffffffffffffc24);
  amrex::Gpu::copy<double*,double*>(local_f0,local_f0 + in_stack_00000010 * 0x16,local_10);
  amrex::Gpu::copy<double*,double*>(local_f8,local_f8 + in_stack_00000010 * 0x15,local_18);
  amrex::Gpu::copy<double*,double*>(local_100,local_100 + in_stack_00000010,local_20);
  amrex::Gpu::copy<double*,double*>(local_108,local_108 + in_stack_00000010,local_28);
  iVar1 = (int)((double)iVar1 / (double)in_stack_00000010);
  amrex::PODVector<int,_std::allocator<int>_>::~PODVector
            ((PODVector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_fffffffffffffc20));
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)CONCAT44(iVar1,in_stack_fffffffffffffc20)
            );
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)CONCAT44(iVar1,in_stack_fffffffffffffc20)
            );
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)CONCAT44(iVar1,in_stack_fffffffffffffc20)
            );
  amrex::PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)CONCAT44(iVar1,in_stack_fffffffffffffc20)
            );
  return iVar1;
}

Assistant:

int
ReactorRK64::react(
  amrex::Real* rY_in,
  amrex::Real* rYsrc_in,
  amrex::Real* rX_in,
  amrex::Real* rX_src_in,
  amrex::Real& dt_react,
  amrex::Real& time,
  int ncells
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t /*stream*/
#endif
)
{
  BL_PROFILE("Pele::ReactorRK64::react()");

  amrex::Real time_init = time;
  amrex::Real time_out = time + dt_react;
  const amrex::Real tinyval = 1e-50;

  // Copy to device
  amrex::Gpu::DeviceVector<amrex::Real> rY(ncells * (NUM_SPECIES + 1), 0);
  amrex::Gpu::DeviceVector<amrex::Real> rYsrc(ncells * NUM_SPECIES, 0);
  amrex::Gpu::DeviceVector<amrex::Real> rX(ncells, 0);
  amrex::Gpu::DeviceVector<amrex::Real> rX_src(ncells, 0);
  amrex::Real* d_rY = rY.data();
  amrex::Real* d_rYsrc = rYsrc.data();
  amrex::Real* d_rX = rX.data();
  amrex::Real* d_rX_src = rX_src.data();
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rY_in, rY_in + ncells * (NUM_SPECIES + 1), d_rY);
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rYsrc_in, rYsrc_in + ncells * NUM_SPECIES,
    d_rYsrc);
  amrex::Gpu::copy(amrex::Gpu::hostToDevice, rX_in, rX_in + ncells, d_rX);
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rX_src_in, rX_src_in + ncells, d_rX_src);

  // capture reactor type
  const int captured_reactor_type = m_reactor_type;
  const int captured_nsubsteps_guess = rk64_nsubsteps_guess;
  const int captured_nsubsteps_min = rk64_nsubsteps_min;
  const int captured_nsubsteps_max = rk64_nsubsteps_max;
  const amrex::Real captured_abstol = absTol;
  RK64Params rkp;

  amrex::Gpu::DeviceVector<int> v_nsteps(ncells, 0);
  int* d_nsteps = v_nsteps.data();

  amrex::ParallelFor(ncells, [=] AMREX_GPU_DEVICE(int icell) noexcept {
    amrex::Real soln_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real carryover_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real error_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real rhs[NUM_SPECIES + 1] = {0.0};
    amrex::Real rYsrc_ext[NUM_SPECIES] = {0.0};
    amrex::Real current_time = time_init;
    const int neq = (NUM_SPECIES + 1);

    for (int sp = 0; sp < neq; sp++) {
      soln_reg[sp] = d_rY[icell * neq + sp];
      carryover_reg[sp] = soln_reg[sp];
    }

    amrex::Real dt_rk = dt_react / amrex::Real(captured_nsubsteps_guess);
    amrex::Real dt_rk_min = dt_react / amrex::Real(captured_nsubsteps_max);
    amrex::Real dt_rk_max = dt_react / amrex::Real(captured_nsubsteps_min);

    amrex::Real rhoe_init[] = {d_rX[icell]};
    amrex::Real rhoesrc_ext[] = {d_rX_src[icell]};

    for (int sp = 0; sp < NUM_SPECIES; sp++) {
      rYsrc_ext[sp] = d_rYsrc[icell * NUM_SPECIES + sp];
    }

    int nsteps = 0;
    amrex::Real change_factor;
    while (current_time < time_out) {
      for (amrex::Real& sp : error_reg) {
        sp = 0.0;
      }
      for (int stage = 0; stage < rkp.nstages_rk64; stage++) {
        utils::fKernelSpec<Ordering>(
          0, 1, current_time - time_init, captured_reactor_type, soln_reg, rhs,
          rhoe_init, rhoesrc_ext, rYsrc_ext);

        for (int sp = 0; sp < neq; sp++) {
          error_reg[sp] += rkp.err_rk64[stage] * dt_rk * rhs[sp];
          soln_reg[sp] =
            carryover_reg[sp] + rkp.alpha_rk64[stage] * dt_rk * rhs[sp];
          carryover_reg[sp] =
            soln_reg[sp] + rkp.beta_rk64[stage] * dt_rk * rhs[sp];
        }
      }

      current_time += dt_rk;
      nsteps++;

      amrex::Real max_err = tinyval;
      for (amrex::Real sp : error_reg) {
        max_err = fabs(sp) > max_err ? fabs(sp) : max_err;
      }

      if (max_err < captured_abstol) {
        change_factor =
          rkp.betaerr_rk64 * pow((captured_abstol / max_err), rkp.exp1_rk64);
        dt_rk = amrex::min<amrex::Real>(dt_rk_max, dt_rk * change_factor);
      } else {
        change_factor =
          rkp.betaerr_rk64 * pow((captured_abstol / max_err), rkp.exp2_rk64);
        dt_rk = amrex::max<amrex::Real>(dt_rk_min, dt_rk * change_factor);
      }
    }
    // Don't overstep the integration time
    dt_rk = amrex::min<amrex::Real>(dt_rk, time_out - current_time);
    d_nsteps[icell] = nsteps;
    // copy data back
    for (int sp = 0; sp < neq; sp++) {
      d_rY[icell * neq + sp] = soln_reg[sp];
    }
    d_rX[icell] = rhoe_init[0] + dt_react * rhoesrc_ext[0];
  });

#ifdef MOD_REACTOR
  time = time_out;
#endif

  const int avgsteps = amrex::Reduce::Sum<int>(
    ncells, [=] AMREX_GPU_DEVICE(int i) noexcept -> int { return d_nsteps[i]; },
    0);

  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rY, d_rY + ncells * (NUM_SPECIES + 1), rY_in);
  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rYsrc, d_rYsrc + ncells * NUM_SPECIES,
    rYsrc_in);
  amrex::Gpu::copy(amrex::Gpu::deviceToHost, d_rX, d_rX + ncells, rX_in);
  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rX_src, d_rX_src + ncells, rX_src_in);

  return (int(avgsteps / amrex::Real(ncells)));
}